

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall Instance::Instance(Instance *this)

{
  this->relax_domains = false;
  this->vtype = 'I';
  this->binary = false;
  (this->Ws).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Ws).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Ws).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Cs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->Cs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->Cs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Qs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->Qs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->Qs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->method = -3;
  this->ndims = 0;
  this->m = 0;
  return;
}

Assistant:

void Instance::init() {
	relax_domains = false;
	binary = false;
	method = -3;
	vtype = 'I';
	ndims = 0;
	m = 0;
}